

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int need_value(FuncState *fs,int list)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  
  if (list != -1) {
    do {
      pIVar1 = fs->f->code + list;
      pIVar2 = pIVar1;
      if ((0 < list) && ((char)luaP_opmodes[(byte)pIVar1[-1]] < '\0')) {
        pIVar2 = pIVar1 + -1;
      }
      if ((char)*pIVar2 != '#') {
        return 1;
      }
      list = list + -0x7fff + (uint)*(ushort *)((long)pIVar1 + 2);
      if (*(ushort *)((long)pIVar1 + 2) == 0x7fff) {
        list = -1;
      }
    } while (list != -1);
  }
  return 0;
}

Assistant:

static int need_value (FuncState *fs, int list) {
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    Instruction i = *getjumpcontrol(fs, list);
    if (GET_OPCODE(i) != OP_TESTSET) return 1;
  }
  return 0;  /* not found */
}